

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

floatx80 subFloatx80Sigs(floatx80 a,floatx80 b,flag zSign,float_status *status)

{
  undefined8 extraout_RDX;
  floatx80 fVar1;
  floatx80 fVar2;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  floatx80 a_06;
  floatx80 b_00;
  floatx80 b_01;
  floatx80 b_02;
  int local_7c;
  uint64_t uStack_78;
  int32_t expDiff;
  uint64_t zSig1;
  uint64_t zSig0;
  uint64_t bSig;
  uint64_t aSig;
  int32_t local_50;
  int32_t zExp;
  int32_t bExp;
  int32_t aExp;
  float_status *status_local;
  uint64_t uStack_38;
  flag zSign_local;
  floatx80 b_local;
  floatx80 a_local;
  
  uStack_38 = b.low;
  b_local._8_8_ = a.low;
  a_01.high = a.high;
  b_local.low._0_2_ = b.high;
  a_00._10_6_ = 0;
  a_00.low = (long)a._0_10_;
  a_00.high = (short)(a._0_10_ >> 0x40);
  _bExp = status;
  status_local._7_1_ = zSign;
  bSig = extractFloatx80Frac(a_00);
  a_01.low = b_local._8_8_;
  a_01._10_6_ = 0;
  zExp = extractFloatx80Exp(a_01);
  a_02.high = (uint16_t)b_local.low;
  a_02.low = uStack_38;
  a_02._10_6_ = 0;
  zSig0 = extractFloatx80Frac(a_02);
  a_03.high = (uint16_t)b_local.low;
  a_03.low = uStack_38;
  a_03._10_6_ = 0;
  local_50 = extractFloatx80Exp(a_03);
  local_7c = zExp - local_50;
  if (local_7c < 1) {
    if (local_7c < 0) {
      if (local_50 == 0x7fff) {
        if ((zSig0 & 0x7fffffffffffffff) == 0) {
          fVar1 = packFloatx80(status_local._7_1_ ^ 1,0x7fff,0x8000000000000000);
          a_01.high = fVar1.high;
        }
        else {
          a_05.high = a_01.high;
          a_05.low = b_local._8_8_;
          b_01.high = (uint16_t)b_local.low;
          b_01.low = uStack_38;
          a_05._10_6_ = 0;
          b_01._10_6_ = 0;
          fVar1 = propagateFloatx80NaN_tricore(a_05,b_01,_bExp);
          a_01.high = fVar1.high;
        }
        goto LAB_012c6ad4;
      }
      if (zExp == 0) {
        local_7c = local_7c + 1;
      }
      shift128RightJamming(bSig,0,-local_7c,&bSig,&stack0xffffffffffffff88);
    }
    else {
      if (zExp == 0x7fff) {
        if (((bSig | zSig0) & 0x7fffffffffffffff) == 0) {
          float_raise_tricore('\x01',_bExp);
          fVar1 = floatx80_default_nan_tricore(_bExp);
          a_01.high = fVar1.high;
        }
        else {
          a_04.high = a_01.high;
          a_04.low = b_local._8_8_;
          b_00.high = (uint16_t)b_local.low;
          b_00.low = uStack_38;
          a_04._10_6_ = 0;
          b_00._10_6_ = 0;
          fVar1 = propagateFloatx80NaN_tricore(a_04,b_00,_bExp);
          a_01.high = fVar1.high;
        }
        goto LAB_012c6ad4;
      }
      if (zExp == 0) {
        zExp = 1;
        local_50 = 1;
      }
      uStack_78 = 0;
      if (zSig0 < bSig) goto LAB_012c6a83;
      if (zSig0 <= bSig) {
        fVar1 = packFloatx80(_bExp->float_rounding_mode == '\x01',0,0);
        a_01.high = fVar1.high;
        goto LAB_012c6ad4;
      }
    }
    sub128(zSig0,0,bSig,uStack_78,&zSig1,&stack0xffffffffffffff88);
    aSig._4_4_ = local_50;
    status_local._7_1_ = status_local._7_1_ ^ 1;
  }
  else {
    if (zExp == 0x7fff) {
      if ((bSig & 0x7fffffffffffffff) == 0) {
        fVar1._8_8_ = extraout_RDX;
        fVar1.low = b_local._8_8_;
      }
      else {
        a_06.high = a_01.high;
        a_06.low = b_local._8_8_;
        b_02.high = (uint16_t)b_local.low;
        b_02.low = uStack_38;
        a_06._10_6_ = 0;
        b_02._10_6_ = 0;
        fVar1 = propagateFloatx80NaN_tricore(a_06,b_02,_bExp);
        a_01.high = fVar1.high;
      }
      goto LAB_012c6ad4;
    }
    if (local_50 == 0) {
      local_7c = local_7c + -1;
    }
    shift128RightJamming(zSig0,0,local_7c,&zSig0,&stack0xffffffffffffff88);
LAB_012c6a83:
    sub128(bSig,0,zSig0,uStack_78,&zSig1,&stack0xffffffffffffff88);
    aSig._4_4_ = zExp;
  }
  fVar1 = normalizeRoundAndPackFloatx80_tricore
                    (_bExp->floatx80_rounding_precision,status_local._7_1_,aSig._4_4_,zSig1,
                     uStack_78,_bExp);
  a_01.high = fVar1.high;
LAB_012c6ad4:
  a_local._8_8_ = fVar1.low;
  fVar2._10_6_ = fVar1._10_6_;
  fVar2.high = a_01.high;
  fVar2.low = a_local._8_8_;
  return fVar2;
}

Assistant:

static floatx80 subFloatx80Sigs(floatx80 a, floatx80 b, flag zSign,
                                float_status *status)
{
    int32_t aExp, bExp, zExp;
    uint64_t aSig, bSig, zSig0, zSig1;
    int32_t expDiff;

    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    bSig = extractFloatx80Frac( b );
    bExp = extractFloatx80Exp( b );
    expDiff = aExp - bExp;
    if ( 0 < expDiff ) goto aExpBigger;
    if ( expDiff < 0 ) goto bExpBigger;
    if ( aExp == 0x7FFF ) {
        if ( (uint64_t) ( ( aSig | bSig )<<1 ) ) {
            return propagateFloatx80NaN(a, b, status);
        }
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }
    if ( aExp == 0 ) {
        aExp = 1;
        bExp = 1;
    }
    zSig1 = 0;
    if ( bSig < aSig ) goto aBigger;
    if ( aSig < bSig ) goto bBigger;
    return packFloatx80(status->float_rounding_mode == float_round_down, 0, 0);
 bExpBigger:
    if ( bExp == 0x7FFF ) {
        if ((uint64_t)(bSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        return packFloatx80(zSign ^ 1, floatx80_infinity_high,
                            floatx80_infinity_low);
    }
    if ( aExp == 0 ) ++expDiff;
    shift128RightJamming( aSig, 0, - expDiff, &aSig, &zSig1 );
 bBigger:
    sub128( bSig, 0, aSig, zSig1, &zSig0, &zSig1 );
    zExp = bExp;
    zSign ^= 1;
    goto normalizeRoundAndPack;
 aExpBigger:
    if ( aExp == 0x7FFF ) {
        if ((uint64_t)(aSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        return a;
    }
    if ( bExp == 0 ) --expDiff;
    shift128RightJamming( bSig, 0, expDiff, &bSig, &zSig1 );
 aBigger:
    sub128( aSig, 0, bSig, zSig1, &zSig0, &zSig1 );
    zExp = aExp;
 normalizeRoundAndPack:
    return normalizeRoundAndPackFloatx80(status->floatx80_rounding_precision,
                                         zSign, zExp, zSig0, zSig1, status);
}